

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_char,signed_char>::
Update<duckdb::BitpackingCompressionState<unsigned_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<unsigned_char,signed_char> *this,uchar value,bool is_valid)

{
  BitpackingState<unsigned_char,signed_char> BVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = *(long *)(this + 0x1810);
  this[lVar3 + 0x1010] = (BitpackingState<unsigned_char,signed_char>)is_valid;
  this[0x182f] = (BitpackingState<unsigned_char,signed_char>)((byte)this[0x182f] & is_valid);
  this[0x1830] = (BitpackingState<unsigned_char,signed_char>)((byte)this[0x1830] & !is_valid);
  if (is_valid) {
    *(uchar *)(*(long *)(this + 0x808) + lVar3) = value;
    BVar1 = SUB41(*(undefined4 *)(this + 0x1828),0);
    if (value <= (byte)SUB41(*(undefined4 *)(this + 0x1828),0)) {
      BVar1 = (BitpackingState<unsigned_char,signed_char>)value;
    }
    this[0x1828] = BVar1;
    if (value < (byte)this[0x1829]) {
      value = (uchar)this[0x1829];
    }
    this[0x1829] = (BitpackingState<unsigned_char,signed_char>)value;
    lVar3 = *(long *)(this + 0x1810);
  }
  *(long *)(this + 0x1810) = lVar3 + 1;
  if (lVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<unsigned_char,true,signed_char>::BitpackingWriter>
                      (this);
    this[0x1828] = (BitpackingState<unsigned_char,signed_char>)0xff;
    this[0x182b] = (BitpackingState<unsigned_char,signed_char>)0x7f;
    *(undefined2 *)(this + 0x1829) = 0;
    *(undefined2 *)(this + 0x182c) = 0x80;
    *(undefined4 *)(this + 0x182e) = 0x10100;
    this[0x1832] = (BitpackingState<unsigned_char,signed_char>)0x0;
    *(undefined8 *)(this + 0x1810) = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}